

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O1

void __thiscall
pbrt::PortalImageInfiniteLight::PDF_Le
          (PortalImageInfiniteLight *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  undefined4 uVar1;
  undefined4 uVar3;
  ulong uVar2;
  float fVar4;
  Float FVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  Vector3f wRender;
  Float duv_dw;
  optional<pbrt::Point2<float>_> uv;
  Bounds2f b;
  float local_40;
  char local_34;
  Bounds2f local_30;
  
  fVar4 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar1 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  uVar3 = (ray->d).super_Tuple3<pbrt::Vector3,_float>.z;
  auVar7._0_4_ = (float)uVar1 * (float)uVar1;
  auVar7._4_4_ = (float)uVar3 * (float)uVar3;
  auVar7._8_8_ = 0;
  auVar8 = vmovshdup_avx(auVar7);
  fVar4 = fVar4 * fVar4 + auVar7._0_4_ + auVar8._0_4_;
  if (fVar4 < 0.0) {
    fVar4 = sqrtf(fVar4);
  }
  else {
    auVar8 = vsqrtss_avx(ZEXT416((uint)fVar4),ZEXT416((uint)fVar4));
    fVar4 = auVar8._0_4_;
  }
  uVar2._0_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.x;
  uVar2._4_4_ = (ray->d).super_Tuple3<pbrt::Vector3,_float>.y;
  auVar8._0_8_ = uVar2 ^ 0x8000000080000000;
  auVar8._8_4_ = 0x80000000;
  auVar8._12_4_ = 0x80000000;
  auVar9._4_4_ = fVar4;
  auVar9._0_4_ = fVar4;
  auVar9._8_4_ = fVar4;
  auVar9._12_4_ = fVar4;
  auVar8 = vdivps_avx(auVar8,auVar9);
  wRender.super_Tuple3<pbrt::Vector3,_float>.z =
       -(ray->d).super_Tuple3<pbrt::Vector3,_float>.z / fVar4;
  wRender.super_Tuple3<pbrt::Vector3,_float>._0_8_ = auVar8._0_8_;
  ImageFromRender((PortalImageInfiniteLight *)&stack0xffffffffffffffc4,wRender,(Float *)this);
  if ((local_34 == '\x01') && ((local_40 != 0.0 || (NAN(local_40))))) {
    auVar6._8_4_ = 0x3f800000;
    auVar6._0_8_ = 0x3f8000003f800000;
    auVar6._12_4_ = 0x3f800000;
    local_30 = (Bounds2f)vmovlhps_avx(ZEXT416(0) << 0x40,auVar6);
    FVar5 = WindowedPiecewiseConstant2D::PDF
                      (&this->distribution,(Point2f *)&stack0xffffffffffffffc4,
                       &stack0xffffffffffffffd0);
    *pdfPos = 1.0 / (this->sceneRadius * this->sceneRadius * 3.1415927);
    *pdfDir = FVar5 / local_40;
  }
  else {
    *pdfDir = 0.0;
    *pdfPos = 0.0;
  }
  return;
}

Assistant:

void PortalImageInfiniteLight::PDF_Le(const Ray &ray, Float *pdfPos,
                                      Float *pdfDir) const {
    // TODO: negate here or???
    Vector3f w = -Normalize(ray.d);
    Float duv_dw;
    pstd::optional<Point2f> uv = ImageFromRender(w, &duv_dw);

    if (!uv || duv_dw == 0) {
        *pdfPos = *pdfDir = 0;
        return;
    }

    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Float pdf = distribution.PDF(*uv, b);

#if 0
    Normal3f n = Normal3f(portalFrame.z);
    *pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    *pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    *pdfDir = pdf / duv_dw;
}